

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O2

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::handleExtremes(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *lp)

{
  pointer pnVar1;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar2;
  int t;
  type_conflict5 tVar3;
  bool bVar4;
  int t_00;
  int t_01;
  uint uVar5;
  int t_02;
  double *pdVar6;
  ulong *puVar7;
  FreeConstraintPS *this_00;
  SPxOut *pSVar8;
  long lVar9;
  long lVar10;
  bool *pbVar11;
  int32_t iVar12;
  int *piVar13;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar14;
  uint uVar15;
  ulong uVar16;
  pointer pnVar17;
  Verbosity *pVVar18;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  *psVar19;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  cpp_dec_float<200u,int,void> *pcVar22;
  multiprecision *pmVar23;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar24;
  fpclass_type fVar25;
  Item *this_01;
  int t_03;
  Item *this_02;
  byte bVar26;
  double dVar27;
  Real eps;
  ulong uVar28;
  ulong local_e90;
  undefined4 local_e68;
  int local_e64;
  ulong local_e60;
  SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_e58;
  cpp_dec_float<200U,_int,_void> local_e50;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *local_dd0;
  shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
  ptr;
  int local_d58;
  bool local_d54;
  ulong local_d50;
  Verbosity old_verbosity_2;
  uint uStack_d44;
  int local_cd8;
  bool local_cd4 [4];
  undefined8 local_cd0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxVal;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  aij;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_bc8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  tol;
  Verbosity old_verbosity;
  int local_ac8;
  bool local_ac4;
  fpclass_type local_ac0;
  int32_t iStack_abc;
  undefined1 local_ab8 [16];
  undefined1 local_aa8 [16];
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a78 [16];
  undefined1 local_a68 [16];
  undefined1 local_a58 [13];
  undefined3 uStack_a4b;
  undefined5 uStack_a48;
  undefined8 local_a40;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a30;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_9b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_930;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_8b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_830;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_7b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_730;
  multiprecision local_6b0 [112];
  int local_640;
  undefined1 local_63c;
  undefined8 local_638;
  multiprecision local_630 [112];
  int local_5c0;
  byte local_5bc;
  ulong local_5b8;
  multiprecision local_5b0 [112];
  int local_540;
  byte local_53c;
  ulong local_538;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_530;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_4b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_430;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_3b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_330;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_230;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1b0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_b0;
  
  bVar26 = 0;
  pdVar6 = (double *)infinity();
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&tol.m_backend,*pdVar6,(type *)0x0);
  _old_verbosity_2 = 5.0;
  maxVal.m_backend.fpclass = cpp_dec_float_finite;
  maxVal.m_backend.prec_elem = 0x1c;
  maxVal.m_backend.data._M_elems[0] = 0;
  maxVal.m_backend.data._M_elems[1] = 0;
  maxVal.m_backend.data._M_elems[2] = 0;
  maxVal.m_backend.data._M_elems[3] = 0;
  maxVal.m_backend.data._M_elems[4] = 0;
  maxVal.m_backend.data._M_elems[5] = 0;
  maxVal.m_backend.data._M_elems[6] = 0;
  maxVal.m_backend.data._M_elems[7] = 0;
  maxVal.m_backend.data._M_elems[8] = 0;
  maxVal.m_backend.data._M_elems[9] = 0;
  maxVal.m_backend.data._M_elems[10] = 0;
  maxVal.m_backend.data._M_elems[0xb] = 0;
  maxVal.m_backend.data._M_elems[0xc] = 0;
  maxVal.m_backend.data._M_elems[0xd] = 0;
  maxVal.m_backend.data._M_elems[0xe] = 0;
  maxVal.m_backend.data._M_elems[0xf] = 0;
  maxVal.m_backend.data._M_elems[0x10] = 0;
  maxVal.m_backend.data._M_elems[0x11] = 0;
  maxVal.m_backend.data._M_elems[0x12] = 0;
  maxVal.m_backend.data._M_elems[0x13] = 0;
  maxVal.m_backend.data._M_elems[0x14] = 0;
  maxVal.m_backend.data._M_elems[0x15] = 0;
  maxVal.m_backend.data._M_elems[0x16] = 0;
  maxVal.m_backend.data._M_elems[0x17] = 0;
  maxVal.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  maxVal.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  maxVal.m_backend.exp = 0;
  maxVal.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            (&maxVal.m_backend,&tol.m_backend,(double *)&old_verbosity_2);
  feastol((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&old_verbosity_2,this);
  local_e50.data._M_elems[0] = 0x47ae147b;
  local_e50.data._M_elems[1] = 0x3f847ae1;
  tol.m_backend.fpclass = cpp_dec_float_finite;
  tol.m_backend.prec_elem = 0x1c;
  tol.m_backend.data._M_elems[0] = 0;
  tol.m_backend.data._M_elems[1] = 0;
  tol.m_backend.data._M_elems[2] = 0;
  tol.m_backend.data._M_elems[3] = 0;
  tol.m_backend.data._M_elems[4] = 0;
  tol.m_backend.data._M_elems[5] = 0;
  tol.m_backend.data._M_elems[6] = 0;
  tol.m_backend.data._M_elems[7] = 0;
  tol.m_backend.data._M_elems[8] = 0;
  tol.m_backend.data._M_elems[9] = 0;
  tol.m_backend.data._M_elems[10] = 0;
  tol.m_backend.data._M_elems[0xb] = 0;
  tol.m_backend.data._M_elems[0xc] = 0;
  tol.m_backend.data._M_elems[0xd] = 0;
  tol.m_backend.data._M_elems[0xe] = 0;
  tol.m_backend.data._M_elems[0xf] = 0;
  tol.m_backend.data._M_elems[0x10] = 0;
  tol.m_backend.data._M_elems[0x11] = 0;
  tol.m_backend.data._M_elems[0x12] = 0;
  tol.m_backend.data._M_elems[0x13] = 0;
  tol.m_backend.data._M_elems[0x14] = 0;
  tol.m_backend.data._M_elems[0x15] = 0;
  tol.m_backend.data._M_elems[0x16] = 0;
  tol.m_backend.data._M_elems[0x17] = 0;
  tol.m_backend.data._M_elems._96_13_ = SUB1613((undefined1  [16])0x0,0);
  tol.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  tol.m_backend.exp = 0;
  tol.m_backend.neg = false;
  boost::multiprecision::default_ops::
  eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,double>
            (&tol.m_backend,(cpp_dec_float<200U,_int,_void> *)&old_verbosity_2,(double *)&local_e50)
  ;
  epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&local_e50,this);
  tVar3 = boost::multiprecision::operator<
                    ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&tol.m_backend,
                     (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)&local_e50);
  if (tVar3) {
    epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)&old_verbosity_2,this);
    fVar25 = (fpclass_type)local_cd0;
    iVar12 = local_cd0._4_4_;
  }
  else {
    pnVar14 = &tol;
    pVVar18 = &old_verbosity_2;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      *pVVar18 = (pnVar14->m_backend).data._M_elems[0];
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
      pVVar18 = pVVar18 + (ulong)bVar26 * -2 + 1;
    }
    local_cd8 = tol.m_backend.exp;
    local_cd4[0] = tol.m_backend.neg;
    fVar25 = tol.m_backend.fpclass;
    iVar12 = tol.m_backend.prec_elem;
    local_cd0._0_4_ = tol.m_backend.fpclass;
    local_cd0._4_4_ = tol.m_backend.prec_elem;
  }
  pVVar18 = &old_verbosity_2;
  pnVar14 = &tol;
  for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
    (pnVar14->m_backend).data._M_elems[0] = *pVVar18;
    pVVar18 = pVVar18 + (ulong)bVar26 * -2 + 1;
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
  }
  tol.m_backend.prec_elem = iVar12;
  tol.m_backend.fpclass = fVar25;
  local_e90 = (ulong)(uint)(lp->
                           super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           ).
                           super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                           .set.thenum;
  local_dd0 = &(this->
               super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>;
  t_00 = 0;
  local_e60 = 0;
  tol.m_backend.exp = local_cd8;
  tol.m_backend.neg = local_cd4[0];
  while( true ) {
    if ((int)local_e90 < 1) break;
    local_e90 = local_e90 - 1;
    uVar16 = local_e90 & 0xffffffff;
    pnVar1 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar17 = pnVar1 + uVar16;
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&old_verbosity_2;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar14->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
      pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar26 * -2 + 1) * 4);
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
    }
    local_cd8 = pnVar1[uVar16].m_backend.exp;
    local_cd4[0] = pnVar1[uVar16].m_backend.neg;
    local_cd0._0_4_ = pnVar1[uVar16].m_backend.fpclass;
    local_cd0._4_4_ = pnVar1[uVar16].m_backend.prec_elem;
    local_e50.data._M_elems[0] = 0;
    local_e50.data._M_elems[1] = 0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&old_verbosity_2,(double *)&local_e50);
    if (tVar3) {
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&old_verbosity_2;
      pnVar24 = &local_330;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar24->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
        pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar24 + ((ulong)bVar26 * -2 + 1) * 4);
      }
      local_330.m_backend.exp = local_cd8;
      local_330.m_backend.neg = local_cd4[0];
      local_330.m_backend.fpclass = (fpclass_type)local_cd0;
      local_330.m_backend.prec_elem = local_cd0._4_4_;
      epsZero(&local_b0,this);
      bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_330,&local_b0);
      if (!bVar4) goto LAB_00401d28;
      dVar27 = 0.0;
LAB_00401e1c:
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_e50,dVar27,(type *)0x0);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x33])(lp,local_e90,&local_e50,0);
      t_00 = t_00 + 1;
    }
    else {
LAB_00401d28:
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_e50,-*pdVar6,(type *)0x0);
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&old_verbosity_2,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_e50);
      if (tVar3) {
        pnVar14 = &maxVal;
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)&ptr;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar21->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar26 * -8 + 4);
        }
        local_d58 = maxVal.m_backend.exp;
        local_d54 = maxVal.m_backend.neg;
        local_d50._0_4_ = maxVal.m_backend.fpclass;
        local_d50._4_4_ = maxVal.m_backend.prec_elem;
        if (maxVal.m_backend.fpclass != cpp_dec_float_finite ||
            (int)ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr != 0) {
          local_d54 = (bool)(maxVal.m_backend.neg ^ 1);
        }
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&old_verbosity_2,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&ptr);
        if (tVar3) {
          puVar7 = (ulong *)infinity();
          dVar27 = (double)(*puVar7 ^ (ulong)DAT_00478010);
          goto LAB_00401e1c;
        }
      }
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_e50,*pdVar6,(type *)0x0);
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&old_verbosity_2,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_e50);
      if ((tVar3) &&
         (tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&old_verbosity_2,&maxVal), tVar3)) {
        pdVar6 = (double *)infinity();
        dVar27 = *pdVar6;
        goto LAB_00401e1c;
      }
    }
    pnVar1 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).right.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar17 = pnVar1 + uVar16;
    pcVar21 = &local_e50;
    for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pcVar21->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
      pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar26 * -2 + 1) * 4);
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar26 * -2 + 1) * 4);
    }
    local_e50.exp = pnVar1[uVar16].m_backend.exp;
    local_e50.neg = pnVar1[uVar16].m_backend.neg;
    local_e50.fpclass = pnVar1[uVar16].m_backend.fpclass;
    local_e50.prec_elem = pnVar1[uVar16].m_backend.prec_elem;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_e50,(double *)&ptr);
    if (tVar3) {
      pcVar21 = &local_e50;
      pnVar14 = &local_3b0;
      for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar26 * -2 + 1) * 4);
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
      }
      local_3b0.m_backend.exp = local_e50.exp;
      local_3b0.m_backend.neg = local_e50.neg;
      local_3b0.m_backend.fpclass = local_e50.fpclass;
      local_3b0.m_backend.prec_elem = local_e50.prec_elem;
      epsZero(&local_130,this);
      bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_3b0,&local_130);
      if (!bVar4) goto LAB_00401f0b;
      dVar27 = 0.0;
LAB_00401fed:
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,dVar27,(type *)0x0);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x36])(lp,local_e90,(cpp_dec_float<200U,_int,_void> *)&ptr,0);
      t_00 = t_00 + 1;
    }
    else {
LAB_00401f0b:
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,-*pdVar6,(type *)0x0);
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_e50,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&ptr);
      if (tVar3) {
        pnVar14 = &maxVal;
        pnVar24 = &aij;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar24->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
          pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar24 + ((ulong)bVar26 * -2 + 1) * 4);
        }
        aij.m_backend.exp = maxVal.m_backend.exp;
        aij.m_backend.neg = maxVal.m_backend.neg;
        aij.m_backend.fpclass = maxVal.m_backend.fpclass;
        aij.m_backend.prec_elem = maxVal.m_backend.prec_elem;
        if (maxVal.m_backend.fpclass != cpp_dec_float_finite || aij.m_backend.data._M_elems[0] != 0)
        {
          aij.m_backend.neg = (bool)(maxVal.m_backend.neg ^ 1);
        }
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_e50,&aij);
        if (tVar3) {
          puVar7 = (ulong *)infinity();
          dVar27 = (double)(*puVar7 ^ (ulong)DAT_00478010);
          goto LAB_00401fed;
        }
      }
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,*pdVar6,(type *)0x0);
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_e50,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&ptr);
      if ((tVar3) &&
         (tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&local_e50,&maxVal), tVar3)) {
        pdVar6 = (double *)infinity();
        dVar27 = *pdVar6;
        goto LAB_00401fed;
      }
    }
    pnVar1 = (lp->
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).left.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    puVar7 = (ulong *)infinity();
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<200U,_int,_void> *)&ptr,(double)(*puVar7 ^ (ulong)DAT_00478010),
               (type *)0x0);
    tVar3 = boost::multiprecision::operator<=
                      (pnVar1 + uVar16,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&ptr);
    if (tVar3) {
      pnVar1 = (lp->
               super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).right.val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&aij.m_backend,*pdVar6,(type *)0x0);
      tVar3 = boost::multiprecision::operator>=
                        (pnVar1 + uVar16,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&aij.m_backend);
      if (tVar3) {
        this_00 = (FreeConstraintPS *)operator_new(0xd0);
        std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_bc8,local_dd0);
        FreeConstraintPS::FreeConstraintPS
                  (this_00,lp,(int)local_e90,(shared_ptr<soplex::Tolerances> *)&local_bc8);
        std::
        __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
        ::
        __shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::FreeConstraintPS,void>
                  ((__shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>::PostStep,(__gnu_cxx::_Lock_policy)2>
                    *)&ptr,this_00);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_bc8._M_refcount);
        std::
        vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
        ::push_back(&(this->m_hist).data,(value_type *)&ptr);
        removeRow(this,lp,(int)local_e90);
        local_e60 = (ulong)((int)local_e60 + 1);
        piVar13 = (this->m_stat).data + 1;
        *piVar13 = *piVar13 + 1;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&ptr.
                    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
      }
    }
  }
  uVar16 = 0;
  t_02 = 0;
  t_01 = 0;
  local_e64 = 0;
  local_e58 = lp;
  do {
    t = local_e64;
    lVar9 = 0x1c;
    if ((long)(lp->
              super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ).
              super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              .set.thenum <= (long)uVar16) {
      t_03 = (int)local_e60;
      if (0 < t_02 + t_01 + t_03 + t_00 + local_e64) {
        piVar13 = &(this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_remRows;
        *piVar13 = *piVar13 + t_03;
        piVar13 = &(this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_remNzos;
        *piVar13 = *piVar13 + local_e64;
        piVar13 = &(this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_chgLRhs;
        *piVar13 = *piVar13 + t_00;
        piVar13 = &(this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).m_chgBnds;
        *piVar13 = *piVar13 + t_01;
        pSVar8 = (this->
                 super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).spxout;
        if ((pSVar8 != (SPxOut *)0x0) && (3 < (int)pSVar8->m_verbosity)) {
          _old_verbosity_2 = (double)CONCAT44(uStack_d44,pSVar8->m_verbosity);
          local_e50.data._M_elems[0] = 4;
          (*pSVar8->_vptr_SPxOut[2])();
          pSVar8 = soplex::operator<<((this->
                                      super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                      ).spxout,"Simplifier (extremes) removed ");
          pSVar8 = soplex::operator<<(pSVar8,t_03);
          pSVar8 = soplex::operator<<(pSVar8," rows, ");
          pSVar8 = soplex::operator<<(pSVar8,t);
          pSVar8 = soplex::operator<<(pSVar8," non-zeros, ");
          pSVar8 = soplex::operator<<(pSVar8,t_01);
          pSVar8 = soplex::operator<<(pSVar8," col bounds, ");
          pSVar8 = soplex::operator<<(pSVar8,t_00);
          pSVar8 = soplex::operator<<(pSVar8," row bounds, ");
          pSVar8 = soplex::operator<<(pSVar8,t_02);
          pSVar8 = soplex::operator<<(pSVar8," objective coefficients");
          std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
          pSVar8 = (this->
                   super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).spxout;
          (*pSVar8->_vptr_SPxOut[2])(pSVar8,&old_verbosity_2);
        }
      }
      return;
    }
    pnVar1 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).low.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar17 = pnVar1 + uVar16;
    pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&old_verbosity_2;
    for (lVar10 = lVar9; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar14->m_backend).data._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
      pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar26 * -2 + 1) * 4);
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
    }
    local_cd8 = pnVar1[uVar16].m_backend.exp;
    local_cd4[0] = pnVar1[uVar16].m_backend.neg;
    local_cd0._0_4_ = pnVar1[uVar16].m_backend.fpclass;
    local_cd0._4_4_ = pnVar1[uVar16].m_backend.prec_elem;
    local_e50.data._M_elems[0] = 0;
    local_e50.data._M_elems[1] = 0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&old_verbosity_2,(double *)&local_e50);
    if (tVar3) {
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&old_verbosity_2;
      pnVar24 = &local_430;
      for (; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar24->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
        pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar24 + ((ulong)bVar26 * -2 + 1) * 4);
      }
      local_430.m_backend.exp = local_cd8;
      local_430.m_backend.neg = local_cd4[0];
      local_430.m_backend.fpclass = (fpclass_type)local_cd0;
      local_430.m_backend.prec_elem = local_cd0._4_4_;
      epsZero(&local_1b0,this);
      bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_430,&local_1b0);
      if (!bVar4) goto LAB_0040224e;
      dVar27 = 0.0;
LAB_004022f8:
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_e50,dVar27,(type *)0x0);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x2a])(lp,uVar16,&local_e50,0);
      t_01 = t_01 + 1;
    }
    else {
LAB_0040224e:
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_e50,-*pdVar6,(type *)0x0);
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&old_verbosity_2,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_e50);
      if (tVar3) {
        pnVar14 = &maxVal;
        pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&ptr;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar24->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
          pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar24 + ((ulong)bVar26 * -2 + 1) * 4);
        }
        local_d58 = maxVal.m_backend.exp;
        local_d54 = maxVal.m_backend.neg;
        local_d50._0_4_ = maxVal.m_backend.fpclass;
        local_d50._4_4_ = maxVal.m_backend.prec_elem;
        if (maxVal.m_backend.fpclass != cpp_dec_float_finite ||
            (int)ptr.
                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr != 0) {
          local_d54 = (bool)(maxVal.m_backend.neg ^ 1);
        }
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&old_verbosity_2,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&ptr);
        if (tVar3) {
          puVar7 = (ulong *)infinity();
          dVar27 = (double)(*puVar7 ^ (ulong)DAT_00478010);
          goto LAB_004022f8;
        }
      }
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&local_e50,*pdVar6,(type *)0x0);
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&old_verbosity_2,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_e50);
      lp = local_e58;
      if ((tVar3) &&
         (tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&old_verbosity_2,&maxVal), lp = local_e58, tVar3)) {
        pdVar6 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&local_e50,*pdVar6,(type *)0x0);
        lp = local_e58;
        (*(local_e58->
          super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ).
          super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          .
          super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
          ._vptr_ClassArray[0x2a])(local_e58,uVar16,&local_e50,0);
        t_01 = t_01 + 1;
      }
    }
    pnVar1 = (lp->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).up.val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar9 = 0x1c;
    pnVar17 = pnVar1 + uVar16;
    pcVar21 = &local_e50;
    for (lVar10 = lVar9; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pcVar21->data)._M_elems[0] = (pnVar17->m_backend).data._M_elems[0];
      pnVar17 = (pointer)((long)pnVar17 + ((ulong)bVar26 * -2 + 1) * 4);
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar26 * -2 + 1) * 4);
    }
    local_e50.exp = pnVar1[uVar16].m_backend.exp;
    local_e50.neg = pnVar1[uVar16].m_backend.neg;
    local_e50.fpclass = pnVar1[uVar16].m_backend.fpclass;
    local_e50.prec_elem = pnVar1[uVar16].m_backend.prec_elem;
    ptr.
    super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_e50,(double *)&ptr);
    if (tVar3) {
      pcVar21 = &local_e50;
      pnVar14 = &local_4b0;
      for (; lVar9 != 0; lVar9 = lVar9 + -1) {
        (pnVar14->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar26 * -2 + 1) * 4);
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
      }
      local_4b0.m_backend.exp = local_e50.exp;
      local_4b0.m_backend.neg = local_e50.neg;
      local_4b0.m_backend.fpclass = local_e50.fpclass;
      local_4b0.m_backend.prec_elem = local_e50.prec_elem;
      epsZero(&local_230,this);
      bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_4b0,&local_230);
      if (!bVar4) goto LAB_004024c9;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,0.0,(type *)0x0);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x2d])(lp,uVar16,(cpp_dec_float<200U,_int,_void> *)&ptr,0);
      t_01 = t_01 + 1;
    }
    else {
LAB_004024c9:
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,-*pdVar6,(type *)0x0);
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_e50,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&ptr);
      if (tVar3) {
        pnVar14 = &maxVal;
        pcVar21 = &aij.m_backend;
        for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pcVar21->data)._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
          pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar26 * -8 + 4);
        }
        aij.m_backend.exp = maxVal.m_backend.exp;
        aij.m_backend.neg = maxVal.m_backend.neg;
        aij.m_backend.fpclass = maxVal.m_backend.fpclass;
        aij.m_backend.prec_elem = maxVal.m_backend.prec_elem;
        if (maxVal.m_backend.fpclass != cpp_dec_float_finite || aij.m_backend.data._M_elems[0] != 0)
        {
          aij.m_backend.neg = (bool)(maxVal.m_backend.neg ^ 1);
        }
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_e50,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&aij.m_backend);
        if (!tVar3) goto LAB_0040257a;
        puVar7 = (ulong *)infinity();
        dVar27 = (double)(*puVar7 ^ (ulong)DAT_00478010);
      }
      else {
LAB_0040257a:
        pdVar6 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  ((cpp_dec_float<200U,_int,_void> *)&ptr,*pdVar6,(type *)0x0);
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_e50,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&ptr);
        if ((!tVar3) ||
           (tVar3 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&local_e50,&maxVal), !tVar3)) goto LAB_004025e9;
        pdVar6 = (double *)infinity();
        dVar27 = *pdVar6;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                ((cpp_dec_float<200U,_int,_void> *)&ptr,dVar27,(type *)0x0);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x2d])(lp,uVar16,(cpp_dec_float<200U,_int,_void> *)&ptr,0);
      t_01 = t_01 + 1;
    }
LAB_004025e9:
    lVar10 = 0x1c;
    pVVar18 = &old_verbosity_2;
    pnVar14 = &local_a30;
    for (lVar9 = lVar10; lVar9 != 0; lVar9 = lVar9 + -1) {
      (pnVar14->m_backend).data._M_elems[0] = *pVVar18;
      pVVar18 = pVVar18 + (ulong)bVar26 * -2 + 1;
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
    }
    local_a30.m_backend.exp = local_cd8;
    local_a30.m_backend.neg = local_cd4[0];
    local_a30.m_backend.fpclass = (fpclass_type)local_cd0;
    local_a30.m_backend.prec_elem = local_cd0._4_4_;
    pcVar21 = &local_e50;
    pnVar14 = &local_530;
    for (; lVar10 != 0; lVar10 = lVar10 + -1) {
      (pnVar14->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar26 * -2 + 1) * 4);
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
    }
    local_530.m_backend.exp = local_e50.exp;
    local_530.m_backend.neg = local_e50.neg;
    local_530.m_backend.fpclass = local_e50.fpclass;
    local_530.m_backend.prec_elem = local_e50.prec_elem;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> *)&ptr,local_dd0);
    eps = Tolerances::epsilon((Tolerances *)
                              ptr.
                              super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                              ._M_ptr);
    bVar4 = NE<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                      (&local_a30,&local_530,eps);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&ptr.
                super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    if (bVar4) {
      lVar9 = 0x1c;
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity_2;
      pmVar23 = local_5b0;
      for (lVar10 = lVar9; lVar10 != 0; lVar10 = lVar10 + -1) {
        *(uint *)pmVar23 = (((cpp_dec_float<200U,_int,_void> *)&pcVar21->data)->data)._M_elems[0];
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar26 * -2 + 1) * 4);
        pmVar23 = pmVar23 + (ulong)bVar26 * -8 + 4;
      }
      local_540 = local_cd8;
      local_53c = local_cd4[0];
      local_538 = local_cd0;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((type *)&ptr,local_5b0,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_5b0);
      psVar19 = &ptr;
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity_2;
      for (lVar10 = lVar9; lVar10 != 0; lVar10 = lVar10 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar21->data)->data)._M_elems[0] =
             *(uint *)&(psVar19->
                       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
        psVar19 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                   *)((long)psVar19 + (ulong)bVar26 * -8 + 4);
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar26 * -2 + 1) * 4);
      }
      local_cd8 = local_d58;
      local_cd4[0] = local_d54;
      local_cd0 = local_d50;
      pcVar21 = &local_e50;
      pmVar23 = local_630;
      for (lVar10 = lVar9; lVar10 != 0; lVar10 = lVar10 + -1) {
        *(uint *)pmVar23 = (((cpp_dec_float<200U,_int,_void> *)&pcVar21->data)->data)._M_elems[0];
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar26 * -2 + 1) * 4);
        pmVar23 = pmVar23 + (ulong)bVar26 * -8 + 4;
      }
      local_5c0 = local_e50.exp;
      local_5bc = local_e50.neg;
      local_5b8._0_4_ = local_e50.fpclass;
      local_5b8._4_4_ = local_e50.prec_elem;
      boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                ((type *)&ptr,local_630,
                 (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)local_630);
      psVar19 = &ptr;
      pcVar21 = &local_e50;
      for (lVar10 = lVar9; lVar10 != 0; lVar10 = lVar10 + -1) {
        (((cpp_dec_float<200U,_int,_void> *)&pcVar21->data)->data)._M_elems[0] =
             *(uint *)&(psVar19->
                       super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                       )._M_ptr;
        psVar19 = (shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>
                   *)((long)psVar19 + (ulong)bVar26 * -8 + 4);
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar26 * -2 + 1) * 4);
      }
      local_e50.exp = local_d58;
      local_e50.neg = local_d54;
      local_e50.fpclass = (undefined4)local_d50;
      local_e50.prec_elem = local_d50._4_4_;
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&old_verbosity_2,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_e50);
      pcVar21 = &local_e50;
      if (tVar3) {
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity_2;
      }
      pcVar22 = (cpp_dec_float<200u,int,void> *)&ptr;
      piVar13 = &local_e50.exp;
      if (tVar3) {
        piVar13 = &local_cd8;
      }
      for (; lVar9 != 0; lVar9 = lVar9 + -1) {
        *(uint *)pcVar22 = (((cpp_dec_float<200U,_int,_void> *)&pcVar21->data)->data)._M_elems[0];
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + ((ulong)bVar26 * -2 + 1) * 4);
        pcVar22 = pcVar22 + (ulong)bVar26 * -8 + 4;
      }
      local_d58 = *piVar13;
      pbVar11 = &local_e50.neg;
      if (tVar3) {
        pbVar11 = local_cd4;
      }
      local_d54 = *pbVar11;
      uVar28 = CONCAT44((int)((uint)tVar3 << 0x1f) >> 0x1f,(int)((uint)tVar3 << 0x1f) >> 0x1f);
      local_d50 = ~uVar28 & local_e50._120_8_ | local_cd0 & uVar28;
      aij.m_backend.data._M_elems[0] = 0;
      aij.m_backend.data._M_elems[1] = 0x3ff00000;
      tVar3 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&ptr,(double *)&aij.m_backend);
      if (tVar3) {
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&ptr,1.0);
      }
      this_01 = (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.theitem +
                (lp->
                super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ).
                super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                .set.thekey[uVar16].idx;
      uVar15 = 0;
      while ((int)uVar15 <
             (this_01->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .memused) {
        pNVar2 = (this_01->data).
                 super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 .m_elem;
        lVar9 = 0x1c;
        pNVar20 = pNVar2 + (int)uVar15;
        pmVar23 = local_6b0;
        for (lVar10 = lVar9; lVar10 != 0; lVar10 = lVar10 + -1) {
          *(uint *)pmVar23 = (pNVar20->val).m_backend.data._M_elems[0];
          pNVar20 = (Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)((long)pNVar20 + ((ulong)bVar26 * -2 + 1) * 4);
          pmVar23 = pmVar23 + (ulong)bVar26 * -8 + 4;
        }
        local_640 = pNVar2[(int)uVar15].val.m_backend.exp;
        local_63c = pNVar2[(int)uVar15].val.m_backend.neg;
        local_638._0_4_ = pNVar2[(int)uVar15].val.m_backend.fpclass;
        local_638._4_4_ = pNVar2[(int)uVar15].val.m_backend.prec_elem;
        boost::multiprecision::abs<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((type *)&aij.m_backend,local_6b0,
                   (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)local_6b0);
        local_a40._0_4_ = cpp_dec_float_finite;
        local_a40._4_4_ = 0x1c;
        local_ab8 = (undefined1  [16])0x0;
        local_aa8 = (undefined1  [16])0x0;
        local_a98 = (undefined1  [16])0x0;
        local_a88 = (undefined1  [16])0x0;
        local_a78 = (undefined1  [16])0x0;
        local_a68 = (undefined1  [16])0x0;
        local_a58 = SUB1613((undefined1  [16])0x0,0);
        uStack_a4b = 0;
        uStack_a48._0_4_ = 0;
        uStack_a48._4_1_ = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  ((cpp_dec_float<200U,_int,_void> *)local_ab8,&aij.m_backend,
                   (cpp_dec_float<200U,_int,_void> *)&ptr);
        pnVar14 = &tol;
        pnVar24 = &local_730;
        for (; lVar9 != 0; lVar9 = lVar9 + -1) {
          (pnVar24->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
          pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar24 + ((ulong)bVar26 * -2 + 1) * 4);
        }
        local_730.m_backend.exp = tol.m_backend.exp;
        local_730.m_backend.neg = tol.m_backend.neg;
        local_730.m_backend.fpclass = tol.m_backend.fpclass;
        local_730.m_backend.prec_elem = tol.m_backend.prec_elem;
        bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)local_ab8,&local_730);
        if (bVar4) {
          this_02 = (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.theitem +
                    (lp->
                    super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ).
                    super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    .set.thekey
                    [(this_01->data).
                     super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .m_elem[(int)uVar15].idx].idx;
          uVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::pos((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         *)this_02,(int)uVar16);
          if (-1 < (int)uVar5) {
            SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                      *)this_02,(char *)(ulong)uVar5);
          }
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::remove((SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *)this_01,(char *)(ulong)uVar15);
          local_e64 = local_e64 + 1;
        }
        else {
          tVar3 = boost::multiprecision::operator>
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&aij.m_backend,&maxVal);
          if (tVar3) {
            pSVar8 = (this->
                     super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).spxout;
            if ((pSVar8 != (SPxOut *)0x0) && (0 < (int)pSVar8->m_verbosity)) {
              local_e68 = 1;
              old_verbosity = pSVar8->m_verbosity;
              (*pSVar8->_vptr_SPxOut[2])(pSVar8,&local_e68);
              pSVar8 = soplex::operator<<((this->
                                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).spxout,"WMAISM05 Warning! Big matrix coefficient ");
              pnVar14 = &local_7b0;
              pcVar21 = &aij.m_backend;
              pnVar24 = pnVar14;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pnVar24->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar26 * -8 + 4)
                ;
                pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar24 + ((ulong)bVar26 * -2 + 1) * 4);
              }
              local_7b0.m_backend.exp = aij.m_backend.exp;
              local_7b0.m_backend.neg = aij.m_backend.neg;
              local_7b0.m_backend.fpclass = aij.m_backend.fpclass;
              local_7b0.m_backend.prec_elem = aij.m_backend.prec_elem;
LAB_00402c2a:
              pSVar8 = soplex::operator<<(pSVar8,pnVar14);
              std::endl<char,std::char_traits<char>>(pSVar8->m_streams[pSVar8->m_verbosity]);
              pSVar8 = (this->
                       super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ).spxout;
              (*pSVar8->_vptr_SPxOut[2])(pSVar8,&old_verbosity);
            }
          }
          else {
            lVar9 = 0x1c;
            pcVar21 = &aij.m_backend;
            pnVar14 = &local_830;
            for (lVar10 = lVar9; lVar10 != 0; lVar10 = lVar10 + -1) {
              (pnVar14->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
              pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar26 * -8 + 4);
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
            }
            local_830.m_backend.exp = aij.m_backend.exp;
            local_830.m_backend.neg = aij.m_backend.neg;
            local_830.m_backend.fpclass = aij.m_backend.fpclass;
            local_830.m_backend.prec_elem = aij.m_backend.prec_elem;
            pnVar14 = &tol;
            pnVar24 = &local_8b0;
            for (; lVar9 != 0; lVar9 = lVar9 + -1) {
              (pnVar24->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
              pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
              pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)((long)pnVar24 + ((ulong)bVar26 * -2 + 1) * 4);
            }
            local_8b0.m_backend.exp = tol.m_backend.exp;
            local_8b0.m_backend.neg = tol.m_backend.neg;
            local_8b0.m_backend.fpclass = tol.m_backend.fpclass;
            local_8b0.m_backend.prec_elem = tol.m_backend.prec_elem;
            bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                              (&local_830,&local_8b0);
            if (((bVar4) &&
                (pSVar8 = (this->
                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                          ).spxout, pSVar8 != (SPxOut *)0x0)) && (0 < (int)pSVar8->m_verbosity)) {
              local_e68 = 1;
              old_verbosity = pSVar8->m_verbosity;
              (*pSVar8->_vptr_SPxOut[2])(pSVar8,&local_e68);
              pSVar8 = soplex::operator<<((this->
                                          super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                          ).spxout,"WMAISM06 Warning! Tiny matrix coefficient ");
              pnVar14 = &local_930;
              pcVar21 = &aij.m_backend;
              pnVar24 = pnVar14;
              for (lVar9 = 0x1c; lVar9 != 0; lVar9 = lVar9 + -1) {
                (pnVar24->m_backend).data._M_elems[0] = (pcVar21->data)._M_elems[0];
                pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar26 * -8 + 4)
                ;
                pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                           *)((long)pnVar24 + ((ulong)bVar26 * -2 + 1) * 4);
              }
              local_930.m_backend.exp = aij.m_backend.exp;
              local_930.m_backend.neg = aij.m_backend.neg;
              local_930.m_backend.fpclass = aij.m_backend.fpclass;
              local_930.m_backend.prec_elem = aij.m_backend.prec_elem;
              goto LAB_00402c2a;
            }
          }
          uVar15 = uVar15 + 1;
        }
      }
    }
    lVar9 = 0x1c;
    SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::obj((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *)&ptr,lp,(int)uVar16);
    aij.m_backend.data._M_elems[0] = 0;
    aij.m_backend.data._M_elems[1] = 0;
    tVar3 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&ptr,(double *)&aij.m_backend);
    if (tVar3) {
      pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *)&ptr;
      pnVar24 = &local_9b0;
      for (lVar10 = lVar9; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pnVar24->m_backend).data._M_elems[0] = (pnVar14->m_backend).data._M_elems[0];
        pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
        pnVar24 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar24 + ((ulong)bVar26 * -2 + 1) * 4);
      }
      local_9b0.m_backend.exp = local_d58;
      local_9b0.m_backend.neg = local_d54;
      local_9b0.m_backend.fpclass = (undefined4)local_d50;
      local_9b0.m_backend.prec_elem = local_d50._4_4_;
      epsZero(&local_2b0,this);
      bVar4 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (&local_9b0,&local_2b0);
      if (!bVar4) goto LAB_00402d3a;
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&aij.m_backend,0.0,(type *)0x0);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x24])(lp,uVar16 & 0xffffffff,&aij.m_backend,0);
      t_02 = t_02 + 1;
    }
    else {
LAB_00402d3a:
      pdVar6 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&aij.m_backend,-*pdVar6,(type *)0x0);
      tVar3 = boost::multiprecision::operator>
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&ptr,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                  *)&aij.m_backend);
      if (tVar3) {
        pnVar14 = &maxVal;
        pVVar18 = &old_verbosity;
        for (; lVar9 != 0; lVar9 = lVar9 + -1) {
          *pVVar18 = (pnVar14->m_backend).data._M_elems[0];
          pnVar14 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar14 + ((ulong)bVar26 * -2 + 1) * 4);
          pVVar18 = pVVar18 + (ulong)bVar26 * -2 + 1;
        }
        local_ac8 = maxVal.m_backend.exp;
        local_ac4 = maxVal.m_backend.neg;
        local_ac0 = maxVal.m_backend.fpclass;
        iStack_abc = maxVal.m_backend.prec_elem;
        if (maxVal.m_backend.fpclass != cpp_dec_float_finite || old_verbosity != ERROR) {
          local_ac4 = (bool)(maxVal.m_backend.neg ^ 1);
        }
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&ptr,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&old_verbosity);
        if (!tVar3) goto LAB_00402de7;
        puVar7 = (ulong *)infinity();
        dVar27 = (double)(*puVar7 ^ (ulong)DAT_00478010);
      }
      else {
LAB_00402de7:
        pdVar6 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&aij.m_backend,*pdVar6,(type *)0x0);
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&ptr,(number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                    *)&aij.m_backend);
        if ((!tVar3) ||
           (tVar3 = boost::multiprecision::operator>
                              ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                *)&ptr,&maxVal), !tVar3)) goto LAB_00402e59;
        pdVar6 = (double *)infinity();
        dVar27 = *pdVar6;
      }
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&aij.m_backend,dVar27,(type *)0x0);
      (*(lp->
        super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ).
        super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        .
        super_ClassArray<soplex::Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
        ._vptr_ClassArray[0x24])(lp,uVar16 & 0xffffffff,&aij.m_backend,0);
      t_02 = t_02 + 1;
    }
LAB_00402e59:
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

void SPxMainSM<R>::handleExtremes(SPxLPBase<R>& lp)
{

   // This method handles extreme value of the given LP by
   //
   // 1. setting numbers of very small absolute values to zero and
   // 2. setting numbers of very large absolute values to R(-infinity) or +R(infinity), respectively.

   R maxVal  = R(infinity) / 5.0;
   R tol = feastol() * 1e-2;
   tol = (tol < this->epsZero()) ? this->epsZero() : tol;
   int  remRows = 0;
   int  remNzos = 0;
   int  chgBnds = 0;
   int  chgLRhs = 0;
   int  objCnt  = 0;

   for(int i = lp.nRows() - 1; i >= 0; --i)
   {
      // lhs
      R lhs = lp.lhs(i);

      if(lhs != 0.0 && isZero(lhs, this->epsZero()))
      {
         lp.changeLhs(i, R(0.0));
         ++chgLRhs;
      }
      else if(lhs > R(-infinity) && lhs < -maxVal)
      {
         lp.changeLhs(i, R(-infinity));
         ++chgLRhs;
      }
      else if(lhs <  R(infinity) && lhs >  maxVal)
      {
         lp.changeLhs(i,  R(infinity));
         ++chgLRhs;
      }

      // rhs
      R rhs = lp.rhs(i);

      if(rhs != 0.0 && isZero(rhs, this->epsZero()))
      {
         lp.changeRhs(i, R(0.0));
         ++chgLRhs;
      }
      else if(rhs > R(-infinity) && rhs < -maxVal)
      {
         lp.changeRhs(i, R(-infinity));
         ++chgLRhs;
      }
      else if(rhs <  R(infinity) && rhs >  maxVal)
      {
         lp.changeRhs(i,  R(infinity));
         ++chgLRhs;
      }

      if(lp.lhs(i) <= R(-infinity) && lp.rhs(i) >= R(infinity))
      {
         std::shared_ptr<PostStep> ptr(new FreeConstraintPS(lp, i, this->_tolerances));
         m_hist.append(ptr);

         removeRow(lp, i);
         ++remRows;

         ++m_stat[FREE_ROW];
      }
   }

   for(int j = 0; j < lp.nCols(); ++j)
   {
      // lower bound
      R lo = lp.lower(j);

      if(lo != 0.0 && isZero(lo, this->epsZero()))
      {
         lp.changeLower(j, R(0.0));
         ++chgBnds;
      }
      else if(lo > R(-infinity) && lo < -maxVal)
      {
         lp.changeLower(j, R(-infinity));
         ++chgBnds;
      }
      else if(lo <  R(infinity) && lo >  maxVal)
      {
         lp.changeLower(j,  R(infinity));
         ++chgBnds;
      }

      // upper bound
      R up = lp.upper(j);

      if(up != 0.0 && isZero(up, this->epsZero()))
      {
         lp.changeUpper(j, R(0.0));
         ++chgBnds;
      }
      else if(up > R(-infinity) && up < -maxVal)
      {
         lp.changeUpper(j, R(-infinity));
         ++chgBnds;
      }
      else if(up <  R(infinity) && up >  maxVal)
      {
         lp.changeUpper(j,  R(infinity));
         ++chgBnds;
      }

      // fixed columns will be eliminated later
      if(NE(lo, up, this->tolerances()->epsilon()))
      {
         lo = spxAbs(lo);
         up = spxAbs(up);

         R absBnd = (lo > up) ? lo : up;

         if(absBnd < 1.0)
            absBnd = 1.0;

         // non-zeros
         SVectorBase<R>& col = lp.colVector_w(j);
         int        i = 0;

         while(i < col.size())
         {
            R aij = spxAbs(col.value(i));

            if(isZero(aij * absBnd, tol))
            {
               SVectorBase<R>& row = lp.rowVector_w(col.index(i));
               int row_j = row.pos(j);

               // this changes col.size()
               if(row_j >= 0)
                  row.remove(row_j);

               col.remove(i);

               SPxOut::debug(this, "IMAISM04 aij={}  removed, absBnd={} \n", aij, absBnd);
               ++remNzos;
            }
            else
            {
               if(aij > maxVal)
               {
                  SPX_MSG_WARNING((*this->spxout),
                                  (*this->spxout) << "WMAISM05 Warning! Big matrix coefficient " << aij
                                  << std::endl);
               }
               else if(isZero(aij, tol))
               {
                  SPX_MSG_WARNING((*this->spxout),
                                  (*this->spxout) << "WMAISM06 Warning! Tiny matrix coefficient " << aij
                                  << std::endl);
               }

               ++i;
            }
         }
      }

      // objective
      R obj = lp.obj(j);

      if(obj != 0.0 && isZero(obj, this->epsZero()))
      {
         lp.changeObj(j, R(0.0));
         ++objCnt;
      }
      else if(obj > R(-infinity) && obj < -maxVal)
      {
         lp.changeObj(j, R(-infinity));
         ++objCnt;
      }
      else if(obj <  R(infinity) && obj >  maxVal)
      {
         lp.changeObj(j,  R(infinity));
         ++objCnt;
      }
   }

   if(remRows + remNzos + chgLRhs + chgBnds + objCnt > 0)
   {
      this->m_remRows += remRows;
      this->m_remNzos += remNzos;
      this->m_chgLRhs += chgLRhs;
      this->m_chgBnds += chgBnds;

      SPX_MSG_INFO2((*this->spxout), (*this->spxout) << "Simplifier (extremes) removed "
                    << remRows << " rows, "
                    << remNzos << " non-zeros, "
                    << chgBnds << " col bounds, "
                    << chgLRhs << " row bounds, "
                    << objCnt  << " objective coefficients" << std::endl;)
   }

   assert(lp.isConsistent());
}